

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

Belief * __thiscall despot::ParticleBelief::MakeCopy(ParticleBelief *this)

{
  DSPOMDP *pDVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference ppSVar5;
  undefined4 extraout_var;
  ParticleBelief *this_00;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_60;
  value_type local_38;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  ParticleBelief *this_local;
  
  copy.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  local_2c = 0;
  while( true ) {
    uVar3 = (ulong)local_2c;
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(&this->particles_);
    if (sVar4 <= uVar3) break;
    pDVar1 = (this->super_Belief).model_;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&this->particles_,(long)local_2c);
    iVar2 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,*ppSVar5);
    local_38 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28,&local_38);
    local_2c = local_2c + 1;
  }
  this_00 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_60,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  ParticleBelief(this_00,&local_60,(this->super_Belief).model_,this->prior_,(bool)(this->split_ & 1)
                );
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_60);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  return &this_00->super_Belief;
}

Assistant:

Belief* ParticleBelief::MakeCopy() const {
	vector<State*> copy;
	for (int i = 0; i < particles_.size(); i++) {
		copy.push_back(model_->Copy(particles_[i]));
	}

	return new ParticleBelief(copy, model_, prior_, split_);
}